

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_modes.c
# Opt level: O3

int aes_ofb_crypt(uchar *ibuf,uchar *obuf,int len,uchar *iv,aes_encrypt_ctx *ctx)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong uVar9;
  uint uVar10;
  
  bVar1 = (ctx->inf).b[2];
  uVar6 = (ulong)bVar1;
  if (bVar1 == 0) {
    uVar9 = 0;
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    if (len < 1 || 0xf < bVar1) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      uVar5 = (ulong)bVar1;
      do {
        uVar6 = uVar5 + 1;
        obuf[uVar9] = ibuf[uVar9] ^ iv[uVar5];
        uVar9 = uVar9 + 1;
        if (0xe < uVar5) break;
        uVar5 = uVar6;
      } while ((int)uVar9 < len);
      ibuf = ibuf + uVar9;
      obuf = obuf + uVar9;
    }
    if ((int)uVar6 != 0x10) {
      uVar7 = uVar6 & 0xffffffff;
    }
  }
  iVar2 = (int)uVar7;
  if (0xf < (uint)(len - (int)uVar9)) {
    iVar4 = (int)uVar9 + 0x10;
    if ((((uint)obuf | (uint)ibuf | (uint)iv) & 3) == 0) {
      if (iVar4 <= len) {
        if (iVar2 != 0) {
          __assert_fail("b_pos == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibAesgm/aes_modes.c"
                        ,0x31d,
                        "int aes_ofb_crypt(const unsigned char *, unsigned char *, int, unsigned char *, aes_encrypt_ctx *)"
                       );
        }
        do {
          iVar4 = aes_encrypt(iv,iv,ctx);
          if (iVar4 != 0) {
            return 1;
          }
          *(uint *)obuf = *(uint *)ibuf ^ *(uint *)iv;
          *(uint *)((long)obuf + 4) = *(uint *)((long)ibuf + 4) ^ *(uint *)(iv + 4);
          *(uint *)((long)obuf + 8) = *(uint *)((long)ibuf + 8) ^ *(uint *)(iv + 8);
          *(uint *)((long)obuf + 0xc) = *(uint *)((long)ibuf + 0xc) ^ *(uint *)(iv + 0xc);
          ibuf = (uchar *)((long)ibuf + 0x10);
          obuf = (uchar *)((long)obuf + 0x10);
          iVar4 = (int)uVar9;
          uVar9 = (ulong)(iVar4 + 0x10);
        } while (iVar4 + 0x20 <= len);
        goto LAB_00271fda;
      }
    }
    else if (iVar4 <= len) {
      if (iVar2 != 0) {
        __assert_fail("b_pos == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibAesgm/aes_modes.c"
                      ,0x32c,
                      "int aes_ofb_crypt(const unsigned char *, unsigned char *, int, unsigned char *, aes_encrypt_ctx *)"
                     );
      }
      do {
        iVar4 = aes_encrypt(iv,iv,ctx);
        if (iVar4 != 0) {
          return 1;
        }
        *obuf = (byte)*(uint *)ibuf ^ *iv;
        *(byte *)((long)obuf + 1) = *(byte *)((long)ibuf + 1) ^ iv[1];
        *(byte *)((long)obuf + 2) = *(byte *)((long)ibuf + 2) ^ iv[2];
        *(byte *)((long)obuf + 3) = *(byte *)((long)ibuf + 3) ^ iv[3];
        *(byte *)((long)obuf + 4) = (byte)*(uint *)((long)ibuf + 4) ^ iv[4];
        *(byte *)((long)obuf + 5) = *(byte *)((long)ibuf + 5) ^ iv[5];
        *(byte *)((long)obuf + 6) = *(byte *)((long)ibuf + 6) ^ iv[6];
        *(byte *)((long)obuf + 7) = *(byte *)((long)ibuf + 7) ^ iv[7];
        *(byte *)((long)obuf + 8) = (byte)*(uint *)((long)ibuf + 8) ^ iv[8];
        *(byte *)((long)obuf + 9) = *(byte *)((long)ibuf + 9) ^ iv[9];
        *(byte *)((long)obuf + 10) = *(byte *)((long)ibuf + 10) ^ iv[10];
        *(byte *)((long)obuf + 0xb) = *(byte *)((long)ibuf + 0xb) ^ iv[0xb];
        *(byte *)((long)obuf + 0xc) = (byte)*(uint *)((long)ibuf + 0xc) ^ iv[0xc];
        *(byte *)((long)obuf + 0xd) = *(byte *)((long)ibuf + 0xd) ^ iv[0xd];
        *(byte *)((long)obuf + 0xe) = *(byte *)((long)ibuf + 0xe) ^ iv[0xe];
        *(byte *)((long)obuf + 0xf) = *(byte *)((long)ibuf + 0xf) ^ iv[0xf];
        ibuf = (uchar *)((long)ibuf + 0x10);
        obuf = (uchar *)((long)obuf + 0x10);
        iVar4 = (int)uVar9;
        uVar9 = (ulong)(iVar4 + 0x10);
      } while (iVar4 + 0x20 <= len);
      goto LAB_00271fda;
    }
  }
  uVar9 = uVar9 & 0xffffffff;
LAB_00271fda:
  iVar4 = (int)uVar9;
  do {
    if (len <= iVar4) {
      (ctx->inf).b[2] = (uint8_t)iVar2;
      return 0;
    }
    uVar3 = (uint)uVar7;
    if ((uVar3 == 0) && (iVar2 = aes_encrypt(iv,iv,ctx), iVar2 != 0)) {
      return 1;
    }
    if (((int)uVar9 < len) && ((int)uVar3 < 0x10)) {
      pbVar8 = iv + uVar7;
      do {
        uVar3 = *(uint *)ibuf;
        ibuf = (uchar *)((long)ibuf + 1);
        *obuf = (byte)uVar3 ^ *pbVar8;
        obuf = (uchar *)((long)obuf + 1);
        uVar10 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar10;
        iVar2 = (int)uVar7;
        uVar3 = iVar2 + 1;
        if (len <= (int)uVar10) break;
        pbVar8 = pbVar8 + 1;
        uVar7 = (ulong)uVar3;
      } while (iVar2 < 0xf);
    }
    uVar7 = (ulong)uVar3;
    if (uVar3 == 0x10) {
      uVar7 = 0;
    }
    iVar2 = (int)uVar7;
    iVar4 = (int)uVar9;
  } while( true );
}

Assistant:

AES_RETURN aes_ofb_crypt(const unsigned char *ibuf, unsigned char *obuf,
                    int len, unsigned char *iv, aes_encrypt_ctx ctx[1])
{   int cnt = 0, b_pos = (int)ctx->inf.b[2], nb;

    if(b_pos)           /* complete any partial block   */
    {
        while(b_pos < AES_BLOCK_SIZE && cnt < len)
        {
            *obuf++ = iv[b_pos++] ^ *ibuf++;
            cnt++;
        }

        b_pos = (b_pos == AES_BLOCK_SIZE ? 0 : b_pos);
    }

    if((nb = (len - cnt) >> 4) != 0)   /* process whole blocks */
    {
#if defined( USE_VIA_ACE_IF_PRESENT )

        if(ctx->inf.b[1] == 0xff)
        {   int m;
            uint8_t *ksp = (uint8_t*)(ctx->ks), *ivp = iv;
            aligned_auto(uint8_t, liv, AES_BLOCK_SIZE, 16);
            via_cwd(cwd, hybrid, enc, 2 * ctx->inf.b[0] - 192);

            if(ALIGN_OFFSET( ctx, 16 ))
                return EXIT_FAILURE;

            if(ALIGN_OFFSET( iv, 16 ))   /* ensure an aligned iv */
            {
                ivp = liv;
                memcpy(liv, iv, AES_BLOCK_SIZE);
            }

            if(!ALIGN_OFFSET( ibuf, 16 ) && !ALIGN_OFFSET( obuf, 16 ))
            {
                via_ofb_op6(ksp, cwd, ibuf, obuf, nb, ivp);
                ibuf += nb * AES_BLOCK_SIZE;
                obuf += nb * AES_BLOCK_SIZE;
                cnt  += nb * AES_BLOCK_SIZE;
            }
            else    /* input, output or both are unaligned  */
        {   aligned_auto(uint8_t, buf, BFR_BLOCKS * AES_BLOCK_SIZE, 16);
            uint8_t *ip, *op;

                while(nb)
                {
                    m = (nb > BFR_BLOCKS ? BFR_BLOCKS : nb), nb -= m;

                    ip = (ALIGN_OFFSET( ibuf, 16 ) ? buf : ibuf);
                    op = (ALIGN_OFFSET( obuf, 16 ) ? buf : obuf);

                    if(ip != ibuf)
                        memcpy(buf, ibuf, m * AES_BLOCK_SIZE);

                    via_ofb_op6(ksp, cwd, ip, op, m, ivp);

                    if(op != obuf)
                        memcpy(obuf, buf, m * AES_BLOCK_SIZE);

                    ibuf += m * AES_BLOCK_SIZE;
                    obuf += m * AES_BLOCK_SIZE;
                    cnt  += m * AES_BLOCK_SIZE;
                }
            }

            if(ivp != iv)
                memcpy(iv, ivp, AES_BLOCK_SIZE);
        }
#else
# ifdef FAST_BUFFER_OPERATIONS
        if(!ALIGN_OFFSET( ibuf, 4 ) && !ALIGN_OFFSET( obuf, 4 ) && !ALIGN_OFFSET( iv, 4 ))
            while(cnt + AES_BLOCK_SIZE <= len)
            {
                assert(b_pos == 0);
                if(aes_encrypt(iv, iv, ctx) != EXIT_SUCCESS)
                    return EXIT_FAILURE;
                lp32(obuf)[0] = lp32(iv)[0] ^ lp32(ibuf)[0];
                lp32(obuf)[1] = lp32(iv)[1] ^ lp32(ibuf)[1];
                lp32(obuf)[2] = lp32(iv)[2] ^ lp32(ibuf)[2];
                lp32(obuf)[3] = lp32(iv)[3] ^ lp32(ibuf)[3];
                ibuf += AES_BLOCK_SIZE;
                obuf += AES_BLOCK_SIZE;
                cnt  += AES_BLOCK_SIZE;
            }
        else
# endif
            while(cnt + AES_BLOCK_SIZE <= len)
            {
                assert(b_pos == 0);
                if(aes_encrypt(iv, iv, ctx) != EXIT_SUCCESS)
                    return EXIT_FAILURE;
                obuf[ 0] = iv[ 0] ^ ibuf[ 0]; obuf[ 1] = iv[ 1] ^ ibuf[ 1];
                obuf[ 2] = iv[ 2] ^ ibuf[ 2]; obuf[ 3] = iv[ 3] ^ ibuf[ 3];
                obuf[ 4] = iv[ 4] ^ ibuf[ 4]; obuf[ 5] = iv[ 5] ^ ibuf[ 5];
                obuf[ 6] = iv[ 6] ^ ibuf[ 6]; obuf[ 7] = iv[ 7] ^ ibuf[ 7];
                obuf[ 8] = iv[ 8] ^ ibuf[ 8]; obuf[ 9] = iv[ 9] ^ ibuf[ 9];
                obuf[10] = iv[10] ^ ibuf[10]; obuf[11] = iv[11] ^ ibuf[11];
                obuf[12] = iv[12] ^ ibuf[12]; obuf[13] = iv[13] ^ ibuf[13];
                obuf[14] = iv[14] ^ ibuf[14]; obuf[15] = iv[15] ^ ibuf[15];
                ibuf += AES_BLOCK_SIZE;
                obuf += AES_BLOCK_SIZE;
                cnt  += AES_BLOCK_SIZE;
            }
#endif
    }

    while(cnt < len)
    {
        if(!b_pos && aes_encrypt(iv, iv, ctx) != EXIT_SUCCESS)
            return EXIT_FAILURE;

        while(cnt < len && b_pos < AES_BLOCK_SIZE)
        {
            *obuf++ = iv[b_pos++] ^ *ibuf++;
            cnt++;
        }

        b_pos = (b_pos == AES_BLOCK_SIZE ? 0 : b_pos);
    }

    ctx->inf.b[2] = (uint8_t)b_pos;
    return EXIT_SUCCESS;
}